

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogConverterCustomText.h
# Opt level: O2

void __thiscall
nowtech::log::
ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
::convert(ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
          *this,bool aValue,uint8_t param_2,uint8_t param_3)

{
  char *aValue_00;
  undefined7 in_register_00000031;
  
  aValue_00 = "false";
  if ((int)CONCAT71(in_register_00000031,aValue) != 0) {
    aValue_00 = "true";
  }
  append(this,aValue_00);
  if (this->mBegin < this->mEnd) {
    *this->mBegin = ' ';
    this->mBegin = this->mBegin + 1;
  }
  return;
}

Assistant:

void convert(bool const aValue, uint8_t const, uint8_t const) noexcept {
    append(aValue ? csTrue : csFalse);
    appendSpace();
  }